

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_binary.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  short sVar1;
  uint __line;
  bool bVar2;
  return_type rVar3;
  __type _Var4;
  Equipment EVar5;
  int16_t iVar6;
  Offset<flatbuffers::String> OVar7;
  Offset<flatbuffers::String> name;
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>_> weapons;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> inventory;
  Offset<MyGame::Sample::Monster> root;
  uint *puVar8;
  String *pSVar9;
  Vec3 *pVVar10;
  Vector<unsigned_char,_unsigned_int> *this;
  Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int> *this_00;
  return_type pWVar11;
  Weapon *this_01;
  Monster *this_02;
  long lVar12;
  short *psVar13;
  char *__assertion;
  ulong uVar14;
  string *__rhs;
  allocator<char> local_161;
  Offset<MyGame::Sample::Weapon> axe;
  Offset<MyGame::Sample::Weapon> sword;
  Vec3 local_158;
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  weapons_vector;
  string local_128;
  string expected_weapon_names [2];
  uchar inv_data [10];
  FlatBufferBuilder builder;
  
  builder.buf_.allocator_ = (Allocator *)0x0;
  builder.buf_.own_allocator_ = false;
  builder.buf_.initial_size_ = 0x400;
  builder.buf_.max_size_ = 0x7fffffff;
  builder.buf_.buffer_minalign_ = 8;
  builder.buf_.reserved_ = 0;
  builder.buf_.size_ = 0;
  builder.length_of_64_bit_region_ = 0;
  builder.nested = false;
  builder.finished = false;
  builder.buf_.buf_ = (uint8_t *)0x0;
  builder.buf_.cur_._0_6_ = 0;
  builder.buf_.cur_._6_2_ = 0;
  builder.buf_.scratch_._0_6_ = 0;
  builder._78_8_ = 0;
  builder.minalign_ = 1;
  builder.force_defaults_ = false;
  builder.dedup_vtables_ = true;
  builder.string_pool = (StringOffsetMap *)0x0;
  OVar7 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                    (&builder,"Sword");
  name = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                   (&builder,"Axe");
  sword = MyGame::Sample::CreateWeapon(&builder,OVar7,3);
  axe = MyGame::Sample::CreateWeapon(&builder,name,5);
  weapons_vector.
  super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  weapons_vector.
  super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  weapons_vector.
  super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ::push_back(&weapons_vector,&sword);
  std::
  vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
  ::push_back(&weapons_vector,&axe);
  weapons = flatbuffers::FlatBufferBuilderImpl<false>::
            CreateVector<flatbuffers::Offset<MyGame::Sample::Weapon>,std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>>>
                      (&builder,&weapons_vector);
  local_158.x_ = 1.0;
  local_158.y_ = 2.0;
  local_158.z_ = 3.0;
  OVar7 = flatbuffers::FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>
                    (&builder,"MyMonster");
  inv_data[0] = '\0';
  inv_data[1] = '\x01';
  inv_data[2] = '\x02';
  inv_data[3] = '\x03';
  inv_data[4] = '\x04';
  inv_data[5] = '\x05';
  inv_data[6] = '\x06';
  inv_data[7] = '\a';
  inv_data[8] = '\b';
  inv_data[9] = '\t';
  inventory = flatbuffers::FlatBufferBuilderImpl<false>::
              CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                        (&builder,inv_data,10);
  root = MyGame::Sample::CreateMonster
                   (&builder,&local_158,0x96,0x50,OVar7,inventory,Color_MIN,weapons,Equipment_MAX,
                    axe.o,(Offset<flatbuffers::Vector<const_MyGame::Sample::Vec3_*,_unsigned_int>_>)
                          0x0);
  flatbuffers::FlatBufferBuilderImpl<false>::Finish<MyGame::Sample::Monster>
            (&builder,root,(char *)0x0);
  puVar8 = (uint *)flatbuffers::FlatBufferBuilderImpl<false>::GetBufferPointer(&builder);
  if (puVar8 == (uint *)0x0) {
    this_02 = (Monster *)0x0;
  }
  else {
    this_02 = (Monster *)((ulong)*puVar8 + (long)puVar8);
  }
  iVar6 = MyGame::Sample::Monster::hp(this_02);
  if (iVar6 == 0x50) {
    iVar6 = MyGame::Sample::Monster::mana(this_02);
    if (iVar6 == 0x96) {
      pSVar9 = MyGame::Sample::Monster::name(this_02);
      flatbuffers::String::str_abi_cxx11_(expected_weapon_names,pSVar9);
      bVar2 = std::operator==(expected_weapon_names,"MyMonster");
      if (bVar2) {
        std::__cxx11::string::~string((string *)expected_weapon_names);
        pVVar10 = MyGame::Sample::Monster::pos(this_02);
        if (pVVar10 == (Vec3 *)0x0) {
          __assertion = "pos";
          __line = 0x4b;
        }
        else if ((pVVar10->z_ != 3.0) || (NAN(pVVar10->z_))) {
          __assertion = "pos->z() == 3.0f";
          __line = 0x4c;
        }
        else {
          this = MyGame::Sample::Monster::inventory(this_02);
          if (this == (Vector<unsigned_char,_unsigned_int> *)0x0) {
            __assertion = "inv";
            __line = 0x51;
          }
          else {
            rVar3 = flatbuffers::Vector<unsigned_char,_unsigned_int>::Get(this,9);
            if (rVar3 == '\t') {
              __rhs = expected_weapon_names;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__rhs,"Sword",(allocator<char> *)&local_128);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)(expected_weapon_names + 1),"Axe",&local_161);
              this_00 = MyGame::Sample::Monster::weapons(this_02);
              uVar14 = 0;
              psVar13 = &DAT_00103024;
              do {
                if (*(uint *)this_00 <= uVar14) {
                  EVar5 = MyGame::Sample::Monster::equipped_type(this_02);
                  if (EVar5 == Equipment_MAX) {
                    this_01 = (Weapon *)MyGame::Sample::Monster::equipped(this_02);
                    pSVar9 = MyGame::Sample::Weapon::name(this_01);
                    flatbuffers::String::str_abi_cxx11_(&local_128,pSVar9);
                    bVar2 = std::operator==(&local_128,"Axe");
                    if (bVar2) {
                      std::__cxx11::string::~string((string *)&local_128);
                      iVar6 = MyGame::Sample::Weapon::damage(this_01);
                      if (iVar6 == 5) {
                        puts("The FlatBuffer was successfully created and verified!");
                        lVar12 = 0x20;
                        do {
                          std::__cxx11::string::~string
                                    ((string *)
                                     ((long)&expected_weapon_names[0]._M_dataplus._M_p + lVar12));
                          lVar12 = lVar12 + -0x20;
                        } while (lVar12 != -0x20);
                        std::
                        _Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                        ::~_Vector_base(&weapons_vector.
                                         super__Vector_base<flatbuffers::Offset<MyGame::Sample::Weapon>,_std::allocator<flatbuffers::Offset<MyGame::Sample::Weapon>_>_>
                                       );
                        flatbuffers::FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&builder);
                        return 0;
                      }
                      __assertion = "equipped->damage() == 5";
                      __line = 100;
                    }
                    else {
                      __assertion = "equipped->name()->str() == \"Axe\"";
                      __line = 99;
                    }
                  }
                  else {
                    __assertion = "monster->equipped_type() == Equipment_Weapon";
                    __line = 0x61;
                  }
                  goto LAB_00101671;
                }
                pWVar11 = flatbuffers::
                          Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>::Get
                                    (this_00,(uint)uVar14);
                pSVar9 = MyGame::Sample::Weapon::name(pWVar11);
                flatbuffers::String::str_abi_cxx11_(&local_128,pSVar9);
                _Var4 = std::operator==(&local_128,__rhs);
                if (!_Var4) {
                  __assertion = "weps->Get(i)->name()->str() == expected_weapon_names[i]";
                  __line = 0x5a;
                  goto LAB_00101671;
                }
                std::__cxx11::string::~string((string *)&local_128);
                pWVar11 = flatbuffers::
                          Vector<flatbuffers::Offset<MyGame::Sample::Weapon>,_unsigned_int>::Get
                                    (this_00,(uint)uVar14);
                iVar6 = MyGame::Sample::Weapon::damage(pWVar11);
                uVar14 = uVar14 + 1;
                __rhs = __rhs + 1;
                sVar1 = *psVar13;
                psVar13 = psVar13 + 1;
              } while (iVar6 == sVar1);
              __assertion = "weps->Get(i)->damage() == expected_weapon_damages[i]";
              __line = 0x5b;
            }
            else {
              __assertion = "inv->Get(9) == 9";
              __line = 0x52;
            }
          }
        }
      }
      else {
        __assertion = "monster->name()->str() == \"MyMonster\"";
        __line = 0x47;
      }
    }
    else {
      __assertion = "monster->mana() == 150";
      __line = 0x46;
    }
  }
  else {
    __assertion = "monster->hp() == 80";
    __line = 0x45;
  }
LAB_00101671:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/samples/sample_binary.cpp"
                ,__line,"int main(int, const char **)");
}

Assistant:

int main(int /*argc*/, const char * /*argv*/[]) {
  // Build up a serialized buffer algorithmically:
  flatbuffers::FlatBufferBuilder builder;

  // First, lets serialize some weapons for the Monster: A 'sword' and an 'axe'.
  auto weapon_one_name = builder.CreateString("Sword");
  short weapon_one_damage = 3;

  auto weapon_two_name = builder.CreateString("Axe");
  short weapon_two_damage = 5;

  // Use the `CreateWeapon` shortcut to create Weapons with all fields set.
  auto sword = CreateWeapon(builder, weapon_one_name, weapon_one_damage);
  auto axe = CreateWeapon(builder, weapon_two_name, weapon_two_damage);

  // Create a FlatBuffer's `vector` from the `std::vector`.
  std::vector<flatbuffers::Offset<Weapon>> weapons_vector;
  weapons_vector.push_back(sword);
  weapons_vector.push_back(axe);
  auto weapons = builder.CreateVector(weapons_vector);

  // Second, serialize the rest of the objects needed by the Monster.
  auto position = Vec3(1.0f, 2.0f, 3.0f);

  auto name = builder.CreateString("MyMonster");

  unsigned char inv_data[] = { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9 };
  auto inventory = builder.CreateVector(inv_data, 10);

  // Shortcut for creating monster with all fields set:
  auto orc = CreateMonster(builder, &position, 150, 80, name, inventory,
                           Color_Red, weapons, Equipment_Weapon, axe.Union());

  builder.Finish(orc);  // Serialize the root of the object.

  // We now have a FlatBuffer we can store on disk or send over a network.

  // ** file/network code goes here :) **
  // access builder.GetBufferPointer() for builder.GetSize() bytes

  // Instead, we're going to access it right away (as if we just received it).

  // Get access to the root:
  auto monster = GetMonster(builder.GetBufferPointer());

  // Get and test some scalar types from the FlatBuffer.
  assert(monster->hp() == 80);
  assert(monster->mana() == 150);  // default
  assert(monster->name()->str() == "MyMonster");

  // Get and test a field of the FlatBuffer's `struct`.
  auto pos = monster->pos();
  assert(pos);
  assert(pos->z() == 3.0f);
  (void)pos;

  // Get a test an element from the `inventory` FlatBuffer's `vector`.
  auto inv = monster->inventory();
  assert(inv);
  assert(inv->Get(9) == 9);
  (void)inv;

  // Get and test the `weapons` FlatBuffers's `vector`.
  std::string expected_weapon_names[] = { "Sword", "Axe" };
  short expected_weapon_damages[] = { 3, 5 };
  auto weps = monster->weapons();
  for (unsigned int i = 0; i < weps->size(); i++) {
    assert(weps->Get(i)->name()->str() == expected_weapon_names[i]);
    assert(weps->Get(i)->damage() == expected_weapon_damages[i]);
  }
  (void)expected_weapon_names;
  (void)expected_weapon_damages;

  // Get and test the `Equipment` union (`equipped` field).
  assert(monster->equipped_type() == Equipment_Weapon);
  auto equipped = static_cast<const Weapon *>(monster->equipped());
  assert(equipped->name()->str() == "Axe");
  assert(equipped->damage() == 5);
  (void)equipped;

  printf("The FlatBuffer was successfully created and verified!\n");
}